

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Array<kj::ArrayPtr<unsigned_char_const>const>>
          (Promise<void> *this,Array<const_kj::ArrayPtr<const_unsigned_char>_> *attachments)

{
  PromiseBase PVar1;
  undefined8 *in_RDX;
  PromiseBase local_38;
  Array<const_kj::ArrayPtr<const_unsigned_char>_> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  local_30.ptr = (ArrayPtr<const_unsigned_char> *)*in_RDX;
  local_30.size_ = in_RDX[1];
  local_30.disposer = (ArrayDisposer *)in_RDX[2];
  *in_RDX = 0;
  in_RDX[1] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Array<kj::ArrayPtr<unsigned_char_const>const>>,kj::_::PromiseDisposer,kj::Array<kj::ArrayPtr<unsigned_char_const>const>>
            ((PromiseDisposer *)&local_38,(OwnPromiseNode *)attachments,&local_30);
  PVar1.node.ptr = local_38.node.ptr;
  local_38.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  Own<kj::_::AttachmentPromiseNode<kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>_>,_kj::_::PromiseDisposer>
  ::dispose((Own<kj::_::AttachmentPromiseNode<kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>_>,_kj::_::PromiseDisposer>
             *)&local_38);
  Array<const_kj::ArrayPtr<const_unsigned_char>_>::~Array(&local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}